

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall kj::anon_unknown_36::WebSocketPipeImpl::abort(WebSocketPipeImpl *this)

{
  RefOrVoid<kj::WebSocket> other;
  PromiseFulfiller<void> *pPVar1;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> local_78;
  undefined1 local_61;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *local_60;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *f;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *_f3846;
  Own<kj::(anonymous_namespace)::WebSocketPipeImpl::Aborted,_std::nullptr_t> local_40;
  Own<kj::WebSocket,_std::nullptr_t> local_30;
  WebSocket *local_20;
  WebSocket *s;
  WebSocket *_s3839;
  WebSocketPipeImpl *this_local;
  
  _s3839 = &this->super_WebSocket;
  local_20 = kj::_::readMaybe<kj::WebSocket>(&this->state);
  s = local_20;
  if (local_20 == (WebSocket *)0x0) {
    heap<kj::(anonymous_namespace)::WebSocketPipeImpl::Aborted>();
    Own<kj::WebSocket,decltype(nullptr)>::
    Own<kj::(anonymous_namespace)::WebSocketPipeImpl::Aborted,void>
              ((Own<kj::WebSocket,decltype(nullptr)> *)&local_30,&local_40);
    Own<kj::WebSocket,_std::nullptr_t>::operator=(&this->ownState,&local_30);
    Own<kj::WebSocket,_std::nullptr_t>::~Own(&local_30);
    Own<kj::(anonymous_namespace)::WebSocketPipeImpl::Aborted,_std::nullptr_t>::~Own(&local_40);
    other = Own<kj::WebSocket,_std::nullptr_t>::operator*(&this->ownState);
    Maybe<kj::WebSocket_&>::operator=(&this->state,other);
    this->aborted = true;
    local_60 = kj::_::readMaybe<kj::PromiseFulfiller<void>,decltype(nullptr)>
                         (&this->abortedFulfiller);
    if (local_60 != (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)0x0) {
      f = local_60;
      pPVar1 = Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->(local_60);
      (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,&local_61);
      Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::Maybe();
      Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::operator=
                (&this->abortedFulfiller,&local_78);
      Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~Maybe(&local_78);
    }
  }
  else {
    (*local_20->_vptr_WebSocket[4])();
  }
  return;
}

Assistant:

void abort() override {
    KJ_IF_SOME(s, state) {
      s.abort();
    } else {
      ownState = heap<Aborted>();
      state = *ownState;

      aborted = true;
      KJ_IF_SOME(f, abortedFulfiller) {
        f->fulfill();
        abortedFulfiller = kj::none;
      }
    }